

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O3

ON_SubDEdgeSharpness ON_SubDEdgeSharpness::Union(ON_SubDEdgeSharpness *a,ON_SubDEdgeSharpness *b)

{
  float fVar1;
  undefined8 uVar2;
  ON_SubDEdgeSharpness OVar3;
  double dVar4;
  ulong uVar5;
  uint uVar6;
  long lVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  undefined8 local_18;
  undefined8 uStack_10;
  
  local_18 = 0;
  uStack_10 = 0;
  uVar2 = *(undefined8 *)a->m_edge_sharpness;
  lVar7 = 0;
  fVar8 = (float)uVar2;
  if ((((fVar8 < 0.0) || (fVar10 = (float)((ulong)uVar2 >> 0x20), fVar10 <= 0.0 && fVar8 <= 0.0)) ||
      (4.0 < fVar8)) || (fVar10 < 0.0)) {
    fVar9 = 0.0;
  }
  else {
    fVar9 = 0.0;
    if (fVar10 <= 4.0) {
      lVar7 = 2;
      fVar9 = fVar8;
      local_18 = uVar2;
    }
  }
  uVar6 = (uint)lVar7;
  uVar2 = *(undefined8 *)b->m_edge_sharpness;
  fVar8 = (float)uVar2;
  if (((0.0 <= fVar8) && (fVar10 = (float)((ulong)uVar2 >> 0x20), 0.0 < fVar10 || 0.0 < fVar8)) &&
     ((fVar8 <= 4.0 && ((0.0 <= fVar10 && (fVar10 <= 4.0)))))) {
    *(undefined8 *)((long)&local_18 + lVar7 * 4) = uVar2;
    uVar6 = uVar6 + 2;
    fVar9 = (float)local_18;
  }
  dVar4 = (double)fVar9;
  if ((fVar9 < 0.0) || (4.0 < dVar4)) {
    fVar8 = ON_FLT_QNAN;
    if ((dVar4 == 5.0) && (!NAN(dVar4))) {
      fVar8 = 5.0;
    }
  }
  else {
    dVar4 = Sanitize(dVar4,0.0);
    fVar8 = (float)dVar4;
  }
  fVar10 = fVar8;
  if (1 < uVar6) {
    uVar5 = 1;
    fVar9 = fVar8;
    do {
      fVar1 = *(float *)((long)&local_18 + uVar5 * 4);
      fVar8 = fVar1;
      if ((fVar9 <= fVar1) && (fVar8 = fVar9, fVar10 < fVar1)) {
        fVar10 = fVar1;
      }
      uVar5 = uVar5 + 1;
      fVar9 = fVar8;
    } while (uVar6 != uVar5);
  }
  OVar3.m_edge_sharpness[1] = fVar10;
  OVar3.m_edge_sharpness[0] = fVar8;
  return (ON_SubDEdgeSharpness)OVar3.m_edge_sharpness;
}

Assistant:

const ON_SubDEdgeSharpness ON_SubDEdgeSharpness::Union(
  const ON_SubDEdgeSharpness& a,
  const ON_SubDEdgeSharpness& b
)
{
  float s[4] = {};
  int count = 0;

  if (a.IsSharp())
  {
    s[0] = a.m_edge_sharpness[0];
    s[1] = a.m_edge_sharpness[1];
    count = 2;
  }
  if (b.IsSharp())
  {
    s[count] = b.m_edge_sharpness[0];
    s[count+1] = b.m_edge_sharpness[1];
    count += 2;
  }
  ON_SubDEdgeSharpness u = ON_SubDEdgeSharpness::FromConstant(s[0]);
  for ( int i = 1; i < count; ++i)
  { 
    float x = s[i];
    if (x < u.m_edge_sharpness[0])
      u.m_edge_sharpness[0] = x;
    else if (x > u.m_edge_sharpness[1])
      u.m_edge_sharpness[1] = x;
  }
  return u;
}